

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::GLSL420Pack::BuiltInAssignmentTest::prepareNextTestCase
          (BuiltInAssignmentTest *this,GLuint test_case_index)

{
  ostringstream *this_00;
  int iVar1;
  uint uVar2;
  undefined1 local_198 [384];
  
  uVar2 = test_case_index + 1;
  if (uVar2 < 3) {
    iVar1 = *(int *)(&DAT_016d2488 + (ulong)uVar2 * 4);
    this->m_case = test_case_index;
    local_198._0_8_ = *(undefined8 *)(**(long **)&this->field_0x70 + 0x10);
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,&DAT_016d2488 + iVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return uVar2 < 3;
}

Assistant:

bool BuiltInAssignmentTest::prepareNextTestCase(glw::GLuint test_case_index)
{
	const GLchar* description = 0;

	switch (test_case_index)
	{
	case (glw::GLuint)-1:
	case 0:
		description = "Testing gl_MinProgramTexelOffset";
		break;
	case 1:
		description = "Testing gl_MaxProgramTexelOffset";
		break;
	default:
		return false;
	}

	m_case = test_case_index;

	m_context.getTestContext().getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;

	return true;
}